

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

string * __thiscall
pbrt::FloatScaledTexture::ToString_abi_cxx11_
          (string *__return_storage_ptr__,FloatScaledTexture *this)

{
  FloatTextureHandle *in_R8;
  
  StringPrintf<pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&>
            (__return_storage_ptr__,(pbrt *)"[ FloatScaledTexture tex: %s scale: %s ]",(char *)this,
             &this->scale,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string FloatScaledTexture::ToString() const {
    return StringPrintf("[ FloatScaledTexture tex: %s scale: %s ]", tex, scale);
}